

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O0

bool __thiscall
FpgaIO::PromReadBlock25AA128(FpgaIO *this,uint16_t addr,quadlet_t *data,uint nquads,uchar chan)

{
  BasePort *pBVar1;
  uint uVar2;
  ostream *this_00;
  nodeaddr_t nVar3;
  PromType local_4c;
  nodeaddr_t address;
  quadlet_t write_data;
  PromType prom_type;
  uchar chan_local;
  uint nquads_local;
  quadlet_t *data_local;
  uint16_t addr_local;
  FpgaIO *this_local;
  
  if ((nquads == 0) || (0x10 < nquads)) {
    this_00 = std::operator<<((ostream *)&std::cout,"invalid number of quadlets");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    if (chan == '\x01') {
      local_4c = PROM_25AA128_1;
    }
    else {
      local_4c = PROM_25AA128;
      if (chan == '\x02') {
        local_4c = PROM_25AA128_2;
      }
    }
    nVar3 = GetPromAddress(this,local_4c,true);
    pBVar1 = (this->super_BoardIO).port;
    uVar2 = (*pBVar1->_vptr_BasePort[0x24])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,nVar3,
                       (ulong)((uint)addr << 8 | 0xfe000000 | nquads - 1));
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = false;
    }
    else {
      pBVar1 = (this->super_BoardIO).port;
      uVar2 = (*pBVar1->_vptr_BasePort[0x26])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,nVar3 | 0x100,data,
                         (ulong)(nquads << 2));
      if ((uVar2 & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool FpgaIO::PromReadBlock25AA128(uint16_t addr, quadlet_t *data, unsigned int nquads, unsigned char chan)
{
    // nquads sanity check
    if (nquads == 0 || nquads > 16) {
        std::cout << "invalid number of quadlets" << std::endl;
        return false;
    }

    PromType prom_type = (chan == 1) ? PROM_25AA128_1 : (chan == 2) ? PROM_25AA128_2 : PROM_25AA128;

    // trigger read
    quadlet_t write_data = 0xFE000000|(addr << 8)|(nquads-1);
    nodeaddr_t address = GetPromAddress(prom_type, true);
    if (!port->WriteQuadlet(BoardId, address, write_data))
        return false;

    // get result
    if (!port->ReadBlock(BoardId, (address|0x0100), data, nquads * 4))
        return false;
    else
        return true;
}